

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

FrameDisplay * __thiscall
Js::InterpreterStackFrame::OP_LdFrameDisplayNoParent<false>
          (InterpreterStackFrame *this,void *argHead,ScriptContext *scriptContext)

{
  bool bVar1;
  RegSlot RVar2;
  void *local_38;
  Var argEnv;
  FrameDisplay *pFStack_28;
  bool strict;
  FrameDisplay *frameDisplay;
  ScriptContext *scriptContext_local;
  void *argHead_local;
  InterpreterStackFrame *this_local;
  
  bVar1 = ParseableFunctionInfo::GetIsStrictMode(*(ParseableFunctionInfo **)(this + 0x88));
  local_38 = (void *)0x0;
  RVar2 = FunctionBody::GetEnvRegister(*(FunctionBody **)(this + 0x88));
  if (RVar2 != 0xffffffff) {
    local_38 = LdEnv(this);
  }
  if (local_38 == (void *)0x0) {
    if (bVar1) {
      pFStack_28 = Js::JavascriptOperators::OP_LdStrictFrameDisplayNoParent(argHead,scriptContext);
    }
    else {
      pFStack_28 = Js::JavascriptOperators::OP_LdFrameDisplayNoParent(argHead,scriptContext);
    }
  }
  else if (bVar1) {
    pFStack_28 = Js::JavascriptOperators::OP_LdStrictFrameDisplay(argHead,local_38,scriptContext);
  }
  else {
    pFStack_28 = Js::JavascriptOperators::OP_LdFrameDisplay(argHead,local_38,scriptContext);
  }
  return pFStack_28;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplayNoParent(void *argHead, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        Var argEnv = nullptr;
        if (innerFD && this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        if (argEnv == nullptr && this->m_functionBody->GetEnvRegister() != Constants::NoRegister)
        {
            argEnv = this->LdEnv();
        }

        if (argEnv == nullptr)
        {
            if (strict)
            {
                frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplayNoParent(argHead, scriptContext);
            }
            else
            {
                frameDisplay = JavascriptOperators::OP_LdFrameDisplayNoParent(argHead, scriptContext);
            }
        }
        else
        {
            if (strict)
            {
                frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplay(argHead, argEnv, scriptContext);
            }
            else
            {
                frameDisplay = JavascriptOperators::OP_LdFrameDisplay(argHead, argEnv, scriptContext);
            }
        }
        return frameDisplay;
    }